

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

void stb__sha1(stb_uchar *chunk,stb_uint *h)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  stb_uint temp_3;
  stb_uint temp_2;
  stb_uint temp_1;
  stb_uint temp;
  stb_uint t;
  stb_uint w [80];
  stb_uint local_30;
  uint local_2c;
  stb_uint e;
  stb_uint d;
  stb_uint c;
  stb_uint b;
  stb_uint a;
  int i;
  stb_uint *h_local;
  stb_uchar *chunk_local;
  
  for (b = 0; (int)b < 0x10; b = b + 1) {
    (&temp)[(int)b] =
         (uint)chunk[(int)(b << 2)] * 0x1000000 + (uint)chunk[(long)(int)(b << 2) + 1] * 0x10000 +
         (uint)chunk[(long)(int)(b << 2) + 2] * 0x100 + (uint)chunk[(long)(int)(b << 2) + 3];
  }
  for (b = 0x10; (int)b < 0x50; b = b + 1) {
    uVar1 = (&temp)[(int)(b - 3)] ^ (&temp)[(int)(b - 8)] ^ (&temp)[(int)(b - 0xe)] ^
            (&temp)[(int)(b - 0x10)];
    (&temp)[(int)b] = uVar1 * 2 | uVar1 >> 0x1f;
  }
  d = h[1];
  e = h[2];
  local_2c = h[3];
  local_30 = h[4];
  c = *h;
  for (b = 0; (int)b < 0x14; b = b + 1) {
    iVar2 = c * 0x20 + (c >> 0x1b) + (local_2c ^ d & (e ^ local_2c)) + local_30;
    lVar3 = (long)(int)b;
    local_30 = local_2c;
    local_2c = e;
    e = d * 0x40000000 + (d >> 2);
    d = c;
    c = iVar2 + 0x5a827999 + (&temp)[lVar3];
  }
  for (; (int)b < 0x28; b = b + 1) {
    iVar2 = c * 0x20 + (c >> 0x1b) + (d ^ e ^ local_2c) + local_30;
    lVar3 = (long)(int)b;
    local_30 = local_2c;
    local_2c = e;
    e = d * 0x40000000 + (d >> 2);
    d = c;
    c = iVar2 + 0x6ed9eba1 + (&temp)[lVar3];
  }
  for (; (int)b < 0x3c; b = b + 1) {
    iVar2 = c * 0x20 + (c >> 0x1b) + (d & e) + (local_2c & (d ^ e)) + local_30;
    lVar3 = (long)(int)b;
    local_30 = local_2c;
    local_2c = e;
    e = d * 0x40000000 + (d >> 2);
    d = c;
    c = iVar2 + -0x70e44324 + (&temp)[lVar3];
  }
  for (; (int)b < 0x50; b = b + 1) {
    iVar2 = c * 0x20 + (c >> 0x1b) + (d ^ e ^ local_2c) + local_30;
    lVar3 = (long)(int)b;
    local_30 = local_2c;
    local_2c = e;
    e = d * 0x40000000 + (d >> 2);
    d = c;
    c = iVar2 + -0x359d3e2a + (&temp)[lVar3];
  }
  *h = c + *h;
  h[1] = d + h[1];
  h[2] = e + h[2];
  h[3] = local_2c + h[3];
  h[4] = local_30 + h[4];
  return;
}

Assistant:

static void stb__sha1(stb_uchar *chunk, stb_uint h[5])
{
   int i;
   stb_uint a,b,c,d,e;
   stb_uint w[80];

   for (i=0; i < 16; ++i)
      w[i] = stb_big32(&chunk[i*4]);
   for (i=16; i < 80; ++i) {
      stb_uint t;
      t = w[i-3] ^ w[i-8] ^ w[i-14] ^ w[i-16];
      w[i] = (t + t) | (t >> 31);
   }

   a = h[0];
   b = h[1];
   c = h[2];
   d = h[3];
   e = h[4];

   #define STB__SHA1(k,f)                                            \
   {                                                                 \
      stb_uint temp = (a << 5) + (a >> 27) + (f) + e + (k) + w[i];  \
      e = d;                                                       \
      d = c;                                                     \
      c = (b << 30) + (b >> 2);                               \
      b = a;                                              \
      a = temp;                                    \
   }

   i=0;
   for (; i < 20; ++i) STB__SHA1(0x5a827999, d ^ (b & (c ^ d))       );
   for (; i < 40; ++i) STB__SHA1(0x6ed9eba1, b ^ c ^ d               );
   for (; i < 60; ++i) STB__SHA1(0x8f1bbcdc, (b & c) + (d & (b ^ c)) );
   for (; i < 80; ++i) STB__SHA1(0xca62c1d6, b ^ c ^ d               );

   #undef STB__SHA1

   h[0] += a;
   h[1] += b;
   h[2] += c;
   h[3] += d;
   h[4] += e;
}